

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

void __thiscall
TestCase::TestCase(TestCase *this,uint timeout,uint unlocked_after,LockstepScheduler *ls)

{
  this->timeout_ = timeout + 0xbc614e;
  this->unlocked_after_ = unlocked_after + 0xbc614e;
  this->ls_ = ls;
  (this->is_done_)._M_base._M_i = false;
  (this->result_).super___atomic_base<int>._M_i = 0x2a;
  (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pthread_mutex_init((pthread_mutex_t *)&this->lock_,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->cond_,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

TestCase(unsigned timeout, unsigned unlocked_after, LockstepScheduler &ls) :
        timeout_(timeout + some_time_us),
        unlocked_after_(unlocked_after + some_time_us),
        ls_(ls)
    {
        pthread_mutex_init(&lock_, NULL);
        pthread_cond_init(&cond_, NULL);
    }